

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  AssertionStats *in_RDI;
  
  ~AssertionStats(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;